

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int filter(int *lb,int *ub,int col,char c)

{
  char c_local;
  int col_local;
  int *ub_local;
  int *lb_local;
  
  while ((opcodes[*lb].str[col] != c && ((c != '\0' || (opcodes[*lb].str[col] != ' '))))) {
    *lb = *lb + 1;
    if (*ub < *lb) {
      return 0;
    }
  }
  while ((opcodes[*ub].str[col] != c && ((c != '\0' || (opcodes[*ub].str[col] != ' '))))) {
    *ub = *ub + -1;
  }
  return 1;
}

Assistant:

int filter(int *lb, int *ub, int col, char c)
{
    while (opcodes[*lb].str[col] != c)
    {
        if (!c && opcodes[*lb].str[col] == ' ')
            break;

        ++*lb;
        if (*lb > *ub)
            return 0;
    }

    while (opcodes[*ub].str[col] != c)
    {
        if (!c && opcodes[*ub].str[col] == ' ')
            break;

        --*ub;
    }

    return 1;
}